

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_ConstructorGetter_Test::TestBody(Transaction_ConstructorGetter_Test *this)

{
  pointer *ppTVar1;
  bool bVar2;
  char *pcVar3;
  char *rhs;
  AssertHelper local_1c88;
  Message local_1c80;
  bool local_1c72;
  bool local_1c71;
  undefined1 local_1c70 [8];
  AssertionResult gtest_ar_64;
  Message local_1c58;
  int local_1c50;
  uint32_t local_1c4c;
  undefined1 local_1c48 [8];
  AssertionResult gtest_ar_63;
  Message local_1c30 [2];
  CfdException *anon_var_0_13;
  byte local_1bc9;
  char *pcStack_1bc8;
  bool gtest_caught_expected_13;
  ConstCharPtr gtest_msg_13;
  Message local_1bb8;
  TxOutReference local_1bb0;
  AssertHelper local_1b60;
  Message local_1b58;
  undefined1 local_1b50 [8];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts_2;
  Message local_1b30;
  int local_1b28;
  uint32_t local_1b24;
  undefined1 local_1b20 [8];
  AssertionResult gtest_ar_62;
  Message local_1b08;
  int local_1b00;
  uint32_t local_1afc;
  undefined1 local_1af8 [8];
  AssertionResult gtest_ar_61;
  Message local_1ae0;
  undefined1 local_1ad8 [8];
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txins_2;
  Message local_1ab8;
  int local_1ab0;
  uint32_t local_1aac;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar_60;
  Message local_1a90 [2];
  CfdException *anon_var_0_12;
  string local_1a78;
  Txid local_1a58;
  byte local_1a31;
  char *pcStack_1a30;
  bool gtest_caught_expected_12;
  ConstCharPtr gtest_msg_12;
  Message local_1a20;
  int local_1a18;
  allocator local_1a11;
  string local_1a10;
  Txid local_19f0;
  uint32_t local_19cc;
  undefined1 local_19c8 [8];
  AssertionResult gtest_ar_59;
  Message local_19b0 [2];
  CfdException *anon_var_0_11;
  byte local_1909;
  char *pcStack_1908;
  bool gtest_caught_expected_11;
  ConstCharPtr gtest_msg_11;
  Message local_18f8;
  TxInReference local_18f0;
  AssertHelper local_1860;
  Message local_1858;
  int local_1850;
  uint32_t local_184c;
  undefined1 local_1848 [8];
  AssertionResult gtest_ar_58;
  Message local_1830;
  int local_1828;
  uint32_t local_1824;
  undefined1 local_1820 [8];
  AssertionResult gtest_ar_57;
  Message local_1808;
  int local_1800;
  uint32_t local_17fc;
  undefined1 local_17f8 [8];
  AssertionResult gtest_ar_56;
  Message local_17e0;
  Txid local_17d8;
  string local_17b8;
  undefined1 local_1798 [8];
  AssertionResult gtest_ar_55;
  Message local_1780;
  ByteData256 local_1778;
  Txid local_1760;
  string local_1740;
  undefined1 local_1720 [8];
  AssertionResult gtest_ar_54;
  Message local_1708;
  uint32_t local_16fc;
  undefined1 local_16f8 [8];
  AssertionResult gtest_ar_53;
  Message local_16e0;
  int32_t local_16d4;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_52;
  Transaction tx_4;
  Transaction copy_tx;
  Message local_1638;
  bool local_162a;
  bool local_1629;
  undefined1 local_1628 [8];
  AssertionResult gtest_ar_51;
  Message local_1610;
  int local_1608;
  uint32_t local_1604;
  undefined1 local_1600 [8];
  AssertionResult gtest_ar_50;
  Message local_15e8 [2];
  CfdException *anon_var_0_10;
  byte local_1581;
  char *pcStack_1580;
  bool gtest_caught_expected_10;
  ConstCharPtr gtest_msg_10;
  Message local_1570;
  TxOutReference local_1568;
  AssertHelper local_1518;
  Message local_1510;
  undefined1 local_1508 [8];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts_1;
  Message local_14e8;
  int local_14e0;
  uint32_t local_14dc;
  undefined1 local_14d8 [8];
  AssertionResult gtest_ar_49;
  Message local_14c0;
  int local_14b8;
  uint32_t local_14b4;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar_48;
  Message local_1498;
  undefined1 local_1490 [8];
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txins_1;
  Message local_1470;
  int local_1468;
  uint32_t local_1464;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar_47;
  Message local_1448 [2];
  CfdException *anon_var_0_9;
  string local_1430;
  Txid local_1410;
  byte local_13e9;
  char *pcStack_13e8;
  bool gtest_caught_expected_9;
  ConstCharPtr gtest_msg_9;
  Message local_13d8;
  int local_13d0;
  allocator local_13c9;
  string local_13c8;
  Txid local_13a8;
  uint32_t local_1384;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar_46;
  Message local_1368 [2];
  CfdException *anon_var_0_8;
  byte local_12c1;
  char *pcStack_12c0;
  bool gtest_caught_expected_8;
  ConstCharPtr gtest_msg_8;
  Message local_12b0;
  TxInReference local_12a8;
  AssertHelper local_1218;
  Message local_1210;
  int local_1208;
  uint32_t local_1204;
  undefined1 local_1200 [8];
  AssertionResult gtest_ar_45;
  Message local_11e8;
  int local_11e0;
  uint32_t local_11dc;
  undefined1 local_11d8 [8];
  AssertionResult gtest_ar_44;
  Message local_11c0;
  int local_11b8;
  uint32_t local_11b4;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar_43;
  Message local_1198;
  Txid local_1190;
  string local_1170;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar_42;
  Message local_1138;
  ByteData256 local_1130;
  Txid local_1118;
  string local_10f8;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar_41;
  Message local_10c0;
  uint32_t local_10b4;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_40;
  Message local_1098;
  int32_t local_108c;
  undefined1 local_1088 [8];
  AssertionResult gtest_ar_39;
  Transaction tx_3;
  Message local_1030;
  string local_1028;
  undefined1 local_1008 [8];
  AssertionResult gtest_ar_38;
  ByteData data;
  Transaction tx_b;
  ByteData exp_data;
  Message local_f80 [2];
  CfdException *anon_var_0_7;
  string local_f68;
  Script local_f48;
  byte local_f09;
  char *pcStack_f08;
  bool gtest_caught_expected_7;
  ConstCharPtr gtest_msg_7;
  Message local_ef8;
  bool local_eea;
  bool local_ee9;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar_37;
  Message local_ed0;
  int local_ec8;
  uint32_t local_ec4;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar_36;
  Message local_ea8 [2];
  CfdException *anon_var_0_6;
  byte local_e41;
  char *pcStack_e40;
  bool gtest_caught_expected_6;
  ConstCharPtr gtest_msg_6;
  Message local_e30;
  int local_e28;
  allocator local_e21;
  string local_e20;
  Script local_e00;
  uint32_t local_dc4;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_35;
  Message local_da8;
  TxOutReference local_da0;
  AssertHelper local_d50;
  Message local_d48;
  undefined1 local_d40 [8];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  Message local_d20;
  int local_d18;
  uint32_t local_d14;
  undefined1 local_d10 [8];
  AssertionResult gtest_ar_34;
  Message local_cf8;
  int local_cf0;
  uint32_t local_cec;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_33;
  Message local_cd0;
  undefined1 local_cc8 [8];
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txins;
  Message local_ca8;
  int local_ca0;
  uint32_t local_c9c;
  undefined1 local_c98 [8];
  AssertionResult gtest_ar_32;
  Message local_c80 [2];
  CfdException *anon_var_0_5;
  string local_c68;
  Txid local_c48;
  byte local_c21;
  char *pcStack_c20;
  bool gtest_caught_expected_5;
  ConstCharPtr gtest_msg_5;
  Message local_c10;
  int local_c08;
  allocator local_c01;
  string local_c00;
  Txid local_be0;
  uint32_t local_bbc;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_31;
  Message local_ba0 [2];
  CfdException *anon_var_0_4;
  byte local_af9;
  char *pcStack_af8;
  bool gtest_caught_expected_4;
  ConstCharPtr gtest_msg_4;
  Message local_ae8;
  TxInReference local_ae0;
  AssertHelper local_a50;
  Message local_a48;
  int local_a40;
  uint32_t local_a3c;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_30;
  Message local_a20;
  int local_a18;
  uint32_t local_a14;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_29;
  Message local_9f8;
  int local_9f0;
  uint32_t local_9ec;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_28;
  Message local_9d0;
  Txid local_9c8;
  string local_9a8;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_27;
  Message local_970;
  ByteData256 local_968;
  Txid local_950;
  string local_930;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_26;
  Message local_8f8;
  uint32_t local_8ec;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_25;
  Message local_8d0;
  int32_t local_8c4;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_24;
  Transaction tx_2;
  Message local_868;
  bool local_85a;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_23;
  Message local_840 [2];
  CfdException *anon_var_0_3;
  byte local_7d9;
  char *pcStack_7d8;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_7c8 [2];
  CfdException *anon_var_0_2;
  byte local_721;
  char *pcStack_720;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_710;
  int local_708;
  uint32_t local_704;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_22;
  Message local_6e8;
  int local_6e0;
  uint32_t local_6dc;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_21;
  Message local_6c0;
  int local_6b8;
  uint32_t local_6b4;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_20;
  Message local_698;
  int local_690;
  uint32_t local_68c;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_19;
  Message local_670;
  int local_668;
  uint32_t local_664;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_18;
  Message local_648;
  Txid local_640;
  string local_620;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_17;
  Message local_5e8;
  ByteData256 local_5e0;
  Txid local_5c8;
  string local_5a8;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_16;
  Message local_570;
  uint32_t local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_15;
  Message local_548;
  int32_t local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_14;
  string local_520;
  undefined1 local_500 [8];
  Transaction tx_1;
  Message local_4b8;
  bool local_4aa;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_13;
  Message local_490 [2];
  CfdException *anon_var_0_1;
  byte local_429;
  char *pcStack_428;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_418 [2];
  CfdException *anon_var_0;
  TxInReference local_400;
  byte local_369;
  char *pcStack_368;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_358;
  int local_350;
  uint32_t local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_12;
  Message local_330;
  int local_328;
  uint32_t local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_11;
  Message local_308;
  int local_300;
  uint32_t local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_10;
  Message local_2e0;
  int local_2d8;
  uint32_t local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_9;
  Message local_2b8;
  int local_2b0;
  uint32_t local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_8;
  Message local_290;
  string local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_7;
  Message local_250;
  Txid local_248;
  string local_228;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_6;
  Message local_1f0;
  ByteData256 local_1e8;
  Txid local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_5;
  Message local_178;
  uint32_t local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  Message local_150;
  int32_t local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Transaction tx;
  Message local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  uint32_t local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  int32_t local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  Transaction empty_tx;
  Transaction_ConstructorGetter_Test *this_local;
  
  cfd::core::Transaction::Transaction((Transaction *)&gtest_ar.message_);
  local_64 = cfd::core::AbstractTransaction::GetVersion((AbstractTransaction *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"empty_tx.GetVersion()","exp_version",&local_64,
             &exp_version);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_9c = cfd::core::AbstractTransaction::GetLockTime((AbstractTransaction *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_98,"empty_tx.GetLockTime()","exp_locktime",&local_9c,
             &exp_locktime);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_e0,(AbstractTransaction *)&gtest_ar.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c0,"empty_tx.GetHex().c_str()","\"02000000000000000000\"",pcVar3,
             "02000000000000000000");
  std::__cxx11::string::~string((string *)&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x37,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  cfd::core::Transaction::Transaction((Transaction *)&gtest_ar_3.message_,2,0);
  local_144 = cfd::core::AbstractTransaction::GetVersion
                        ((AbstractTransaction *)&gtest_ar_3.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_140,"tx.GetVersion()","exp_version",&local_144,&exp_version);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_16c = cfd::core::AbstractTransaction::GetLockTime
                        ((AbstractTransaction *)&gtest_ar_3.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_168,"tx.GetLockTime()","exp_locktime",&local_16c,&exp_locktime
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  cfd::core::AbstractTransaction::GetHash(&local_1e8,(AbstractTransaction *)&gtest_ar_3.message_);
  cfd::core::Txid::Txid(&local_1d0,&local_1e8);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_1b0,&local_1d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_190,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",pcVar3,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  std::__cxx11::string::~string((string *)&local_1b0);
  cfd::core::Txid::~Txid(&local_1d0);
  cfd::core::ByteData256::~ByteData256(&local_1e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  cfd::core::AbstractTransaction::GetTxid(&local_248,(AbstractTransaction *)&gtest_ar_3.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_228,&local_248);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208,"tx.GetTxid().GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",pcVar3,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  std::__cxx11::string::~string((string *)&local_228);
  cfd::core::Txid::~Txid(&local_248);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_288,(AbstractTransaction *)&gtest_ar_3.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_268,"tx.GetHex().c_str()","\"02000000000000000000\"",pcVar3,
             "02000000000000000000");
  std::__cxx11::string::~string((string *)&local_288);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2ac = cfd::core::Transaction::GetTotalSize((Transaction *)&gtest_ar_3.message_);
  local_2b0 = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2a8,"tx.GetTotalSize()","10",&local_2ac,&local_2b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_2d4 = cfd::core::Transaction::GetVsize((Transaction *)&gtest_ar_3.message_);
  local_2d8 = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2d0,"tx.GetVsize()","10",&local_2d4,&local_2d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_2fc = cfd::core::Transaction::GetWeight((Transaction *)&gtest_ar_3.message_);
  local_300 = 0x28;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2f8,"tx.GetWeight()","40",&local_2fc,&local_300);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_324 = cfd::core::Transaction::GetTxInCount((Transaction *)&gtest_ar_3.message_);
  local_328 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_320,"tx.GetTxInCount()","0",&local_324,&local_328);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_330);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_34c = cfd::core::Transaction::GetTxOutCount((Transaction *)&gtest_ar_3.message_);
  local_350 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_348,"tx.GetTxOutCount()","0",&local_34c,&local_350);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc98,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc98);
  if (bVar2) {
    local_369 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn(&local_400,(Transaction *)&gtest_ar_3.message_,0);
      cfd::core::TxInReference::~TxInReference(&local_400);
    }
    if ((local_369 & 1) == 0) {
      pcStack_368 = 
      "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a2b7b;
    }
  }
  else {
LAB_002a2b7b:
    testing::Message::Message(local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x49,pcStack_368);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_418);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffbd8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffbd8);
  if (bVar2) {
    local_429 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut
                ((TxOutReference *)&anon_var_0_1,(Transaction *)&gtest_ar_3.message_,0);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0_1);
    }
    if ((local_429 & 1) == 0) {
      pcStack_428 = 
      "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a2d19;
    }
  }
  else {
LAB_002a2d19:
    testing::Message::Message(local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x4a,pcStack_428);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_490);
  }
  local_4a9 = cfd::core::Transaction::HasWitness((Transaction *)&gtest_ar_3.message_);
  local_4aa = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_4a8,"tx.HasWitness()","false",&local_4a9,&local_4aa);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx_1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx_1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx_1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_3.message_);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,"02000000000000000000",
             (allocator *)((long)&gtest_ar_14.message_.ptr_ + 7));
  cfd::core::Transaction::Transaction((Transaction *)local_500,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_14.message_.ptr_ + 7));
  local_53c = cfd::core::AbstractTransaction::GetVersion((AbstractTransaction *)local_500);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_538,"tx.GetVersion()","exp_version",&local_53c,&exp_version);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  local_564 = cfd::core::AbstractTransaction::GetLockTime((AbstractTransaction *)local_500);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_560,"tx.GetLockTime()","exp_locktime",&local_564,&exp_locktime
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar2) {
    testing::Message::Message(&local_570);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  cfd::core::AbstractTransaction::GetHash(&local_5e0,(AbstractTransaction *)local_500);
  cfd::core::Txid::Txid(&local_5c8,&local_5e0);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_5a8,&local_5c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_588,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",pcVar3,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  std::__cxx11::string::~string((string *)&local_5a8);
  cfd::core::Txid::~Txid(&local_5c8);
  cfd::core::ByteData256::~ByteData256(&local_5e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar2) {
    testing::Message::Message(&local_5e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  cfd::core::AbstractTransaction::GetTxid(&local_640,(AbstractTransaction *)local_500);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_620,&local_640);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_600,"tx.GetTxid().GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",pcVar3,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  std::__cxx11::string::~string((string *)&local_620);
  cfd::core::Txid::~Txid(&local_640);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar2) {
    testing::Message::Message(&local_648);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  local_664 = cfd::core::Transaction::GetTotalSize((Transaction *)local_500);
  local_668 = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_660,"tx.GetTotalSize()","10",&local_664,&local_668);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar2) {
    testing::Message::Message(&local_670);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  local_68c = cfd::core::Transaction::GetVsize((Transaction *)local_500);
  local_690 = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_688,"tx.GetVsize()","10",&local_68c,&local_690);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar2) {
    testing::Message::Message(&local_698);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  local_6b4 = cfd::core::Transaction::GetWeight((Transaction *)local_500);
  local_6b8 = 0x28;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_6b0,"tx.GetWeight()","40",&local_6b4,&local_6b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar2) {
    testing::Message::Message(&local_6c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  local_6dc = cfd::core::Transaction::GetTxInCount((Transaction *)local_500);
  local_6e0 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_6d8,"tx.GetTxInCount()","0",&local_6dc,&local_6e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar2) {
    testing::Message::Message(&local_6e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  local_704 = cfd::core::Transaction::GetTxOutCount((Transaction *)local_500);
  local_708 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_700,"tx.GetTxOutCount()","0",&local_704,&local_708);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar2) {
    testing::Message::Message(&local_710);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff8e0,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff8e0);
  if (bVar2) {
    local_721 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn((TxInReference *)&anon_var_0_2,(Transaction *)local_500,0);
      cfd::core::TxInReference::~TxInReference((TxInReference *)&anon_var_0_2);
    }
    if ((local_721 & 1) == 0) {
      pcStack_720 = 
      "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a3db8;
    }
  }
  else {
LAB_002a3db8:
    testing::Message::Message(local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5e,pcStack_720);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(local_7c8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff828,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff828);
  if (bVar2) {
    local_7d9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut((TxOutReference *)&anon_var_0_3,(Transaction *)local_500,0);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0_3);
    }
    if ((local_7d9 & 1) == 0) {
      pcStack_7d8 = 
      "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a3f56;
    }
  }
  else {
LAB_002a3f56:
    testing::Message::Message(local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5f,pcStack_7d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_840);
  }
  local_859 = cfd::core::Transaction::HasWitness((Transaction *)local_500);
  local_85a = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_858,"tx.HasWitness()","false",&local_859,&local_85a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar2) {
    testing::Message::Message(&local_868);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx_2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx_2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx_2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  cfd::core::Transaction::~Transaction((Transaction *)local_500);
  cfd::core::Transaction::Transaction
            ((Transaction *)&gtest_ar_24.message_,&exp_tx_witness_abi_cxx11_);
  local_8c4 = cfd::core::AbstractTransaction::GetVersion
                        ((AbstractTransaction *)&gtest_ar_24.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_8c0,"tx.GetVersion()","exp_version",&local_8c4,&exp_version);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar2) {
    testing::Message::Message(&local_8d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_8ec = cfd::core::AbstractTransaction::GetLockTime
                        ((AbstractTransaction *)&gtest_ar_24.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_8e8,"tx.GetLockTime()","exp_locktime",&local_8ec,&exp_locktime
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar2) {
    testing::Message::Message(&local_8f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  cfd::core::AbstractTransaction::GetWitnessHash
            (&local_968,(AbstractTransaction *)&gtest_ar_24.message_);
  cfd::core::Txid::Txid(&local_950,&local_968);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_930,&local_950);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_910,"Txid(tx.GetWitnessHash()).GetHex().c_str()",
             "\"7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d\"",pcVar3,
             "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
  std::__cxx11::string::~string((string *)&local_930);
  cfd::core::Txid::~Txid(&local_950);
  cfd::core::ByteData256::~ByteData256(&local_968);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar2) {
    testing::Message::Message(&local_970);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  cfd::core::AbstractTransaction::GetTxid(&local_9c8,(AbstractTransaction *)&gtest_ar_24.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_9a8,&local_9c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_988,"tx.GetTxid().GetHex().c_str()",
             "\"08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7\"",pcVar3,
             "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
  std::__cxx11::string::~string((string *)&local_9a8);
  cfd::core::Txid::~Txid(&local_9c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar2) {
    testing::Message::Message(&local_9d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_9ec = cfd::core::Transaction::GetTotalSize((Transaction *)&gtest_ar_24.message_);
  local_9f0 = 0xf7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_9e8,"tx.GetTotalSize()","247",&local_9ec,&local_9f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar2) {
    testing::Message::Message(&local_9f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  local_a14 = cfd::core::Transaction::GetVsize((Transaction *)&gtest_ar_24.message_);
  local_a18 = 0xa6;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_a10,"tx.GetVsize()","166",&local_a14,&local_a18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
  if (!bVar2) {
    testing::Message::Message(&local_a20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
  local_a3c = cfd::core::Transaction::GetWeight((Transaction *)&gtest_ar_24.message_);
  local_a40 = 0x295;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_a38,"tx.GetWeight()","661",&local_a3c,&local_a40);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar2) {
    testing::Message::Message(&local_a48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              (&local_a50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a50,&local_a48);
    testing::internal::AssertHelper::~AssertHelper(&local_a50);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn(&local_ae0,(Transaction *)&gtest_ar_24.message_,0);
      cfd::core::TxInReference::~TxInReference(&local_ae0);
    }
  }
  else {
    testing::Message::Message(&local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x72,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_4,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_4);
    testing::Message::~Message(&local_ae8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff508,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff508);
  if (bVar2) {
    local_af9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn
                ((TxInReference *)&anon_var_0_4,(Transaction *)&gtest_ar_24.message_,1);
      cfd::core::TxInReference::~TxInReference((TxInReference *)&anon_var_0_4);
    }
    if ((local_af9 & 1) == 0) {
      pcStack_af8 = 
      "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a4dda;
    }
  }
  else {
LAB_002a4dda:
    testing::Message::Message(local_ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x73,pcStack_af8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_ba0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c00,"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"
             ,&local_c01);
  cfd::core::Txid::Txid(&local_be0,&local_c00);
  local_bbc = cfd::core::Transaction::GetTxInIndex
                        ((Transaction *)&gtest_ar_24.message_,&local_be0,0);
  local_c08 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_bb8,
             "tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 0)"
             ,"0",&local_bbc,&local_c08);
  cfd::core::Txid::~Txid(&local_be0);
  std::__cxx11::string::~string((string *)&local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar2) {
    testing::Message::Message(&local_c10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_5,&local_c10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_5);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff3e0,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff3e0);
  if (bVar2) {
    local_c21 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c68,
                 "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1",
                 (allocator *)((long)&anon_var_0_5 + 7));
      cfd::core::Txid::Txid(&local_c48,&local_c68);
      cfd::core::Transaction::GetTxInIndex((Transaction *)&gtest_ar_24.message_,&local_c48,1);
      cfd::core::Txid::~Txid(&local_c48);
      std::__cxx11::string::~string((string *)&local_c68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_5 + 7));
    }
    if ((local_c21 & 1) == 0) {
      pcStack_c20 = 
      "Expected: tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a5240;
    }
  }
  else {
LAB_002a5240:
    testing::Message::Message(local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x7f,pcStack_c20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_c80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_c80);
  }
  local_c9c = cfd::core::Transaction::GetTxInCount((Transaction *)&gtest_ar_24.message_);
  local_ca0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_c98,"tx.GetTxInCount()","1",&local_c9c,&local_ca0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c98);
  if (!bVar2) {
    testing::Message::Message(&local_ca8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txins.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txins.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txins.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c98);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_cc8,(Transaction *)&gtest_ar_24.message_);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_cc8);
    }
  }
  else {
    testing::Message::Message(&local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x81,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_cd0);
  }
  local_cec = cfd::core::Transaction::GetScriptWitnessStackNum
                        ((Transaction *)&gtest_ar_24.message_,0);
  local_cf0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_ce8,"tx.GetScriptWitnessStackNum(0)","2",&local_cec,&local_cf0
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar2) {
    testing::Message::Message(&local_cf8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d14 = cfd::core::Transaction::GetTxOutCount((Transaction *)&gtest_ar_24.message_);
  local_d18 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_d10,"tx.GetTxOutCount()","2",&local_d14,&local_d18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar2) {
    testing::Message::Message(&local_d20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txouts.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txouts.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d20);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txouts.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_d40,(Transaction *)&gtest_ar_24.message_);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_d40);
    }
  }
  else {
    testing::Message::Message(&local_d48);
    testing::internal::AssertHelper::AssertHelper
              (&local_d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x84,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d50,&local_d48);
    testing::internal::AssertHelper::~AssertHelper(&local_d50);
    testing::Message::~Message(&local_d48);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut(&local_da0,(Transaction *)&gtest_ar_24.message_,0);
      cfd::core::TxOutReference::~TxOutReference(&local_da0);
    }
  }
  else {
    testing::Message::Message(&local_da8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x85,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_da8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e20,"a9142699570770f32e0cf3e1d12d81064fbc45899e8a87",&local_e21);
  cfd::core::Script::Script(&local_e00,&local_e20);
  local_dc4 = cfd::core::Transaction::GetTxOutIndex((Transaction *)&gtest_ar_24.message_,&local_e00)
  ;
  local_e28 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_dc0,
             "tx.GetTxOutIndex(Script(\"a9142699570770f32e0cf3e1d12d81064fbc45899e8a87\"))","1",
             &local_dc4,&local_e28);
  cfd::core::Script::~Script(&local_e00);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar2) {
    testing::Message::Message(&local_e30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_6,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_6);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff1c0,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff1c0);
  if (bVar2) {
    local_e41 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut
                ((TxOutReference *)&anon_var_0_6,(Transaction *)&gtest_ar_24.message_,2);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0_6);
    }
    if ((local_e41 & 1) == 0) {
      pcStack_e40 = 
      "Expected: tx.GetTxOut(2) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a5d5a;
    }
  }
  else {
LAB_002a5d5a:
    testing::Message::Message(local_ea8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x89,pcStack_e40);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,local_ea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(local_ea8);
  }
  local_ec4 = cfd::core::Transaction::GetWallyFlag((Transaction *)&gtest_ar_24.message_);
  local_ec8 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_ec0,"tx.GetWallyFlag()","1",&local_ec4,&local_ec8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec0);
  if (!bVar2) {
    testing::Message::Message(&local_ed0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ec0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_ed0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec0);
  local_ee9 = cfd::core::Transaction::HasWitness((Transaction *)&gtest_ar_24.message_);
  local_eea = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_ee8,"tx.HasWitness()","true",&local_ee9,&local_eea);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee8);
  if (!bVar2) {
    testing::Message::Message(&local_ef8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ee8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_7,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_7);
    testing::Message::~Message(&local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff0f8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff0f8);
  if (bVar2) {
    local_f09 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f68,"a9142699570970f32e0cf3e1d12d81064fbc45899e8a87",
                 (allocator *)((long)&anon_var_0_7 + 7));
      cfd::core::Script::Script(&local_f48,&local_f68);
      cfd::core::Transaction::GetTxOutIndex((Transaction *)&gtest_ar_24.message_,&local_f48);
      cfd::core::Script::~Script(&local_f48);
      std::__cxx11::string::~string((string *)&local_f68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_7 + 7));
    }
    if ((local_f09 & 1) == 0) {
      pcStack_f08 = 
      "Expected: tx.GetTxOutIndex(Script(\"a9142699570970f32e0cf3e1d12d81064fbc45899e8a87\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a624e;
    }
  }
  else {
LAB_002a624e:
    testing::Message::Message(local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x8e,pcStack_f08);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_f80);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_f80);
  }
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_24.message_);
  ppTVar1 = &tx_b.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::ByteData::ByteData((ByteData *)ppTVar1,&exp_tx_witness_abi_cxx11_);
  cfd::core::Transaction::Transaction
            ((Transaction *)
             &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData *)ppTVar1);
  cfd::core::AbstractTransaction::GetData
            ((ByteData *)&gtest_ar_38.message_,
             (AbstractTransaction *)
             &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1028,(ByteData *)&gtest_ar_38.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1008,"data.GetHex().c_str()","exp_tx_witness.c_str()",pcVar3,rhs);
  std::__cxx11::string::~string((string *)&local_1028);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1008);
  if (!bVar2) {
    testing::Message::Message(&local_1030);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx_3.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx_3.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1030);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx_3.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1030);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1008);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_38.message_);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tx_b.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Transaction::Transaction
            ((Transaction *)&gtest_ar_39.message_,&exp_tx_legacy_abi_cxx11_);
  local_108c = cfd::core::AbstractTransaction::GetVersion
                         ((AbstractTransaction *)&gtest_ar_39.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1088,"tx.GetVersion()","exp_version",&local_108c,&exp_version)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1088);
  if (!bVar2) {
    testing::Message::Message(&local_1098);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1088);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1088);
  local_10b4 = cfd::core::AbstractTransaction::GetLockTime
                         ((AbstractTransaction *)&gtest_ar_39.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_10b0,"tx.GetLockTime()","exp_locktime",&local_10b4,
             &exp_locktime);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar2) {
    testing::Message::Message(&local_10c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_10c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_10c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  cfd::core::AbstractTransaction::GetHash(&local_1130,(AbstractTransaction *)&gtest_ar_39.message_);
  cfd::core::Txid::Txid(&local_1118,&local_1130);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_10f8,&local_1118);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10d8,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590\"",pcVar3,
             "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  std::__cxx11::string::~string((string *)&local_10f8);
  cfd::core::Txid::~Txid(&local_1118);
  cfd::core::ByteData256::~ByteData256(&local_1130);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d8);
  if (!bVar2) {
    testing::Message::Message(&local_1138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_1138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_1138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d8);
  cfd::core::AbstractTransaction::GetTxid(&local_1190,(AbstractTransaction *)&gtest_ar_39.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_1170,&local_1190);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1150,"tx.GetTxid().GetHex().c_str()",
             "\"85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590\"",pcVar3,
             "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  std::__cxx11::string::~string((string *)&local_1170);
  cfd::core::Txid::~Txid(&local_1190);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1150);
  if (!bVar2) {
    testing::Message::Message(&local_1198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_1198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_1198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1150);
  local_11b4 = cfd::core::Transaction::GetTotalSize((Transaction *)&gtest_ar_39.message_);
  local_11b8 = 0xbd;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_11b0,"tx.GetTotalSize()","189",&local_11b4,&local_11b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b0);
  if (!bVar2) {
    testing::Message::Message(&local_11c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_11c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_11c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b0);
  local_11dc = cfd::core::Transaction::GetVsize((Transaction *)&gtest_ar_39.message_);
  local_11e0 = 0xbd;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_11d8,"tx.GetVsize()","189",&local_11dc,&local_11e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d8);
  if (!bVar2) {
    testing::Message::Message(&local_11e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_11e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_11e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d8);
  local_1204 = cfd::core::Transaction::GetWeight((Transaction *)&gtest_ar_39.message_);
  local_1208 = 0x2f4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1200,"tx.GetWeight()","756",&local_1204,&local_1208);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1200);
  if (!bVar2) {
    testing::Message::Message(&local_1210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1200);
    testing::internal::AssertHelper::AssertHelper
              (&local_1218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1218,&local_1210);
    testing::internal::AssertHelper::~AssertHelper(&local_1218);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1200);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn(&local_12a8,(Transaction *)&gtest_ar_39.message_,0);
      cfd::core::TxInReference::~TxInReference(&local_12a8);
    }
  }
  else {
    testing::Message::Message(&local_12b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa6,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_8,&local_12b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_8);
    testing::Message::~Message(&local_12b0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffed40,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffed40);
  if (bVar2) {
    local_12c1 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn
                ((TxInReference *)&anon_var_0_8,(Transaction *)&gtest_ar_39.message_,1);
      cfd::core::TxInReference::~TxInReference((TxInReference *)&anon_var_0_8);
    }
    if ((local_12c1 & 1) == 0) {
      pcStack_12c0 = 
      "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a71c6;
    }
  }
  else {
LAB_002a71c6:
    testing::Message::Message(local_1368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa7,pcStack_12c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,local_1368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(local_1368);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_13c8,
             "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6",&local_13c9);
  cfd::core::Txid::Txid(&local_13a8,&local_13c8);
  local_1384 = cfd::core::Transaction::GetTxInIndex
                         ((Transaction *)&gtest_ar_39.message_,&local_13a8,0);
  local_13d0 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1380,
             "tx.GetTxInIndex( Txid( \"405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6\"), 0)"
             ,"0",&local_1384,&local_13d0);
  cfd::core::Txid::~Txid(&local_13a8);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar2) {
    testing::Message::Message(&local_13d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_9,&local_13d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_9);
    testing::Message::~Message(&local_13d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffec18,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffec18);
  if (bVar2) {
    local_13e9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1430,
                 "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6",
                 (allocator *)((long)&anon_var_0_9 + 7));
      cfd::core::Txid::Txid(&local_1410,&local_1430);
      cfd::core::Transaction::GetTxInIndex((Transaction *)&gtest_ar_39.message_,&local_1410,1);
      cfd::core::Txid::~Txid(&local_1410);
      std::__cxx11::string::~string((string *)&local_1430);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_9 + 7));
    }
    if ((local_13e9 & 1) == 0) {
      pcStack_13e8 = 
      "Expected: tx.GetTxInIndex( Txid( \"405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a762c;
    }
  }
  else {
LAB_002a762c:
    testing::Message::Message(local_1448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb3,pcStack_13e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,local_1448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(local_1448);
  }
  local_1464 = cfd::core::Transaction::GetTxInCount((Transaction *)&gtest_ar_39.message_);
  local_1468 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1460,"tx.GetTxInCount()","1",&local_1464,&local_1468);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
  if (!bVar2) {
    testing::Message::Message(&local_1470);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txins_1.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txins_1.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1470);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txins_1.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_1490,(Transaction *)&gtest_ar_39.message_);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_1490);
    }
  }
  else {
    testing::Message::Message(&local_1498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb5,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_1498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1498);
  }
  local_14b4 = cfd::core::Transaction::GetScriptWitnessStackNum
                         ((Transaction *)&gtest_ar_39.message_,0);
  local_14b8 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_14b0,"tx.GetScriptWitnessStackNum(0)","0",&local_14b4,
             &local_14b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
  if (!bVar2) {
    testing::Message::Message(&local_14c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_14b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_14c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_14c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
  local_14dc = cfd::core::Transaction::GetTxOutCount((Transaction *)&gtest_ar_39.message_);
  local_14e0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_14d8,"tx.GetTxOutCount()","1",&local_14dc,&local_14e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14d8);
  if (!bVar2) {
    testing::Message::Message(&local_14e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_14d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txouts_1.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txouts_1.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_14e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txouts_1.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_14e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14d8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_1508,(Transaction *)&gtest_ar_39.message_);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_1508);
    }
  }
  else {
    testing::Message::Message(&local_1510);
    testing::internal::AssertHelper::AssertHelper
              (&local_1518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb8,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1518,&local_1510);
    testing::internal::AssertHelper::~AssertHelper(&local_1518);
    testing::Message::~Message(&local_1510);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut(&local_1568,(Transaction *)&gtest_ar_39.message_,0);
      cfd::core::TxOutReference::~TxOutReference(&local_1568);
    }
  }
  else {
    testing::Message::Message(&local_1570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb9,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_10,&local_1570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_10);
    testing::Message::~Message(&local_1570);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffea80,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffea80);
  if (bVar2) {
    local_1581 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut
                ((TxOutReference *)&anon_var_0_10,(Transaction *)&gtest_ar_39.message_,1);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0_10);
    }
    if ((local_1581 & 1) == 0) {
      pcStack_1580 = 
      "Expected: tx.GetTxOut(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a7f2d;
    }
  }
  else {
LAB_002a7f2d:
    testing::Message::Message(local_15e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xba,pcStack_1580);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,local_15e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(local_15e8);
  }
  local_1604 = cfd::core::Transaction::GetWallyFlag((Transaction *)&gtest_ar_39.message_);
  local_1608 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1600,"tx.GetWallyFlag()","1",&local_1604,&local_1608);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1600);
  if (!bVar2) {
    testing::Message::Message(&local_1610);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xbb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_1610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_1610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1600);
  local_1629 = cfd::core::Transaction::HasWitness((Transaction *)&gtest_ar_39.message_);
  local_162a = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_1628,"tx.HasWitness()","false",&local_1629,&local_162a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1628);
  if (!bVar2) {
    testing::Message::Message(&local_1638);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &copy_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &copy_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1638);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &copy_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1628);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_39.message_);
  ppTVar1 = &tx_4.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::Transaction::Transaction((Transaction *)ppTVar1,&exp_tx_witness_abi_cxx11_);
  cfd::core::Transaction::Transaction((Transaction *)&gtest_ar_52.message_,(Transaction *)ppTVar1);
  local_16d4 = cfd::core::AbstractTransaction::GetVersion
                         ((AbstractTransaction *)&gtest_ar_52.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_16d0,"tx.GetVersion()","exp_version",&local_16d4,&exp_version)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
  if (!bVar2) {
    testing::Message::Message(&local_16e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_16e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
  local_16fc = cfd::core::AbstractTransaction::GetLockTime
                         ((AbstractTransaction *)&gtest_ar_52.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_16f8,"tx.GetLockTime()","exp_locktime",&local_16fc,
             &exp_locktime);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f8);
  if (!bVar2) {
    testing::Message::Message(&local_1708);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_16f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_1708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_1708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f8);
  cfd::core::AbstractTransaction::GetWitnessHash
            (&local_1778,(AbstractTransaction *)&gtest_ar_52.message_);
  cfd::core::Txid::Txid(&local_1760,&local_1778);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_1740,&local_1760);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1720,"Txid(tx.GetWitnessHash()).GetHex().c_str()",
             "\"7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d\"",pcVar3,
             "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
  std::__cxx11::string::~string((string *)&local_1740);
  cfd::core::Txid::~Txid(&local_1760);
  cfd::core::ByteData256::~ByteData256(&local_1778);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1720);
  if (!bVar2) {
    testing::Message::Message(&local_1780);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_1780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_1780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1720);
  cfd::core::AbstractTransaction::GetTxid(&local_17d8,(AbstractTransaction *)&gtest_ar_52.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_17b8,&local_17d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1798,"tx.GetTxid().GetHex().c_str()",
             "\"08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7\"",pcVar3,
             "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
  std::__cxx11::string::~string((string *)&local_17b8);
  cfd::core::Txid::~Txid(&local_17d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1798);
  if (!bVar2) {
    testing::Message::Message(&local_17e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_17e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_17e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1798);
  local_17fc = cfd::core::Transaction::GetTotalSize((Transaction *)&gtest_ar_52.message_);
  local_1800 = 0xf7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_17f8,"tx.GetTotalSize()","247",&local_17fc,&local_1800);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17f8);
  if (!bVar2) {
    testing::Message::Message(&local_1808);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_17f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_1808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_1808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17f8);
  local_1824 = cfd::core::Transaction::GetVsize((Transaction *)&gtest_ar_52.message_);
  local_1828 = 0xa6;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1820,"tx.GetVsize()","166",&local_1824,&local_1828);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1820);
  if (!bVar2) {
    testing::Message::Message(&local_1830);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_1830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_1830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1820);
  local_184c = cfd::core::Transaction::GetWeight((Transaction *)&gtest_ar_52.message_);
  local_1850 = 0x295;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1848,"tx.GetWeight()","661",&local_184c,&local_1850);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1848);
  if (!bVar2) {
    testing::Message::Message(&local_1858);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1848);
    testing::internal::AssertHelper::AssertHelper
              (&local_1860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1860,&local_1858);
    testing::internal::AssertHelper::~AssertHelper(&local_1860);
    testing::Message::~Message(&local_1858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1848);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn(&local_18f0,(Transaction *)&gtest_ar_52.message_,0);
      cfd::core::TxInReference::~TxInReference(&local_18f0);
    }
  }
  else {
    testing::Message::Message(&local_18f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcf,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_11,&local_18f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_11);
    testing::Message::~Message(&local_18f8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffe6f8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffe6f8);
  if (bVar2) {
    local_1909 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn
                ((TxInReference *)&anon_var_0_11,(Transaction *)&gtest_ar_52.message_,1);
      cfd::core::TxInReference::~TxInReference((TxInReference *)&anon_var_0_11);
    }
    if ((local_1909 & 1) == 0) {
      pcStack_1908 = 
      "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a8f2d;
    }
  }
  else {
LAB_002a8f2d:
    testing::Message::Message(local_19b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xd0,pcStack_1908);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,local_19b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(local_19b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a10,
             "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1",&local_1a11);
  cfd::core::Txid::Txid(&local_19f0,&local_1a10);
  local_19cc = cfd::core::Transaction::GetTxInIndex
                         ((Transaction *)&gtest_ar_52.message_,&local_19f0,0);
  local_1a18 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_19c8,
             "tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 0)"
             ,"0",&local_19cc,&local_1a18);
  cfd::core::Txid::~Txid(&local_19f0);
  std::__cxx11::string::~string((string *)&local_1a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a11);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c8);
  if (!bVar2) {
    testing::Message::Message(&local_1a20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_19c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xd6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_12,&local_1a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_12);
    testing::Message::~Message(&local_1a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffe5d0,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffe5d0);
  if (bVar2) {
    local_1a31 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a78,
                 "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1",
                 (allocator *)((long)&anon_var_0_12 + 7));
      cfd::core::Txid::Txid(&local_1a58,&local_1a78);
      cfd::core::Transaction::GetTxInIndex((Transaction *)&gtest_ar_52.message_,&local_1a58,1);
      cfd::core::Txid::~Txid(&local_1a58);
      std::__cxx11::string::~string((string *)&local_1a78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_12 + 7));
    }
    if ((local_1a31 & 1) == 0) {
      pcStack_1a30 = 
      "Expected: tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a9393;
    }
  }
  else {
LAB_002a9393:
    testing::Message::Message(local_1a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xdc,pcStack_1a30);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,local_1a90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(local_1a90);
  }
  local_1aac = cfd::core::Transaction::GetTxInCount((Transaction *)&gtest_ar_52.message_);
  local_1ab0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1aa8,"tx.GetTxInCount()","1",&local_1aac,&local_1ab0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa8);
  if (!bVar2) {
    testing::Message::Message(&local_1ab8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1aa8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txins_2.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txins_2.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1ab8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txins_2.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_1ad8,(Transaction *)&gtest_ar_52.message_);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 local_1ad8);
    }
  }
  else {
    testing::Message::Message(&local_1ae0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xde,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_1ae0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_1ae0);
  }
  local_1afc = cfd::core::Transaction::GetScriptWitnessStackNum
                         ((Transaction *)&gtest_ar_52.message_,0);
  local_1b00 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1af8,"tx.GetScriptWitnessStackNum(0)","2",&local_1afc,
             &local_1b00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1af8);
  if (!bVar2) {
    testing::Message::Message(&local_1b08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,&local_1b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(&local_1b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1af8);
  local_1b24 = cfd::core::Transaction::GetTxOutCount((Transaction *)&gtest_ar_52.message_);
  local_1b28 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1b20,"tx.GetTxOutCount()","2",&local_1b24,&local_1b28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b20);
  if (!bVar2) {
    testing::Message::Message(&local_1b30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txouts_2.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txouts_2.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b30);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txouts_2.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_1b50,(Transaction *)&gtest_ar_52.message_);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 local_1b50);
    }
  }
  else {
    testing::Message::Message(&local_1b58);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe1,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1b60,&local_1b58);
    testing::internal::AssertHelper::~AssertHelper(&local_1b60);
    testing::Message::~Message(&local_1b58);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut(&local_1bb0,(Transaction *)&gtest_ar_52.message_,0);
      cfd::core::TxOutReference::~TxOutReference(&local_1bb0);
    }
  }
  else {
    testing::Message::Message(&local_1bb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe2,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_13,&local_1bb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_13);
    testing::Message::~Message(&local_1bb8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffe438,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffe438);
  if (bVar2) {
    local_1bc9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxOut
                ((TxOutReference *)&anon_var_0_13,(Transaction *)&gtest_ar_52.message_,2);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0_13);
    }
    if ((local_1bc9 & 1) != 0) goto LAB_002a9d2e;
    pcStack_1bc8 = 
    "Expected: tx.GetTxOut(2) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1c30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xe3,pcStack_1bc8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,local_1c30);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
  testing::Message::~Message(local_1c30);
LAB_002a9d2e:
  local_1c4c = cfd::core::Transaction::GetWallyFlag((Transaction *)&gtest_ar_52.message_);
  local_1c50 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1c48,"tx.GetWallyFlag()","1",&local_1c4c,&local_1c50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c48);
  if (!bVar2) {
    testing::Message::Message(&local_1c58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_1c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_1c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c48);
  local_1c71 = cfd::core::Transaction::HasWitness((Transaction *)&gtest_ar_52.message_);
  local_1c72 = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_1c70,"tx.HasWitness()","true",&local_1c71,&local_1c72);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c70);
  if (!bVar2) {
    testing::Message::Message(&local_1c80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c88,&local_1c80);
    testing::internal::AssertHelper::~AssertHelper(&local_1c88);
    testing::Message::~Message(&local_1c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c70);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_52.message_);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &tx_4.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Transaction, ConstructorGetter) {
  {
    Transaction empty_tx;
    EXPECT_EQ(empty_tx.GetVersion(), exp_version);
    EXPECT_EQ(empty_tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(empty_tx.GetHex().c_str(), "02000000000000000000");

    // new transaction
    Transaction tx(exp_version, exp_locktime);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(tx.GetHex().c_str(), "02000000000000000000");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(empty)
    Transaction tx("02000000000000000000");
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(witness)
    Transaction tx(exp_tx_witness);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_EQ(
        tx.GetTxOutIndex(Script("a9142699570770f32e0cf3e1d12d81064fbc45899e8a87")),
        1);
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
    EXPECT_THROW(
        tx.GetTxOutIndex(Script("a9142699570970f32e0cf3e1d12d81064fbc45899e8a87")),
        CfdException);
  }

  {
    ByteData exp_data = ByteData(exp_tx_witness);
    Transaction tx_b(exp_data);
    ByteData data = tx_b.GetData();
    EXPECT_STREQ(data.GetHex().c_str(), exp_tx_witness.c_str());
  }

  {
    // hex to transaction(legacy)
    Transaction tx(exp_tx_legacy);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_EQ(tx.GetTotalSize(), 189);
    EXPECT_EQ(tx.GetVsize(), 189);
    EXPECT_EQ(tx.GetWeight(), 756);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 1);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(1), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // copy constructor
    Transaction copy_tx(exp_tx_witness);
    Transaction tx(copy_tx);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
  }
}